

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void PrintEscapedName(ExpressionTranslateContext *ctx,InplaceStr name)

{
  char ch_00;
  uint uVar1;
  uint local_24;
  char ch;
  uint i;
  ExpressionTranslateContext *ctx_local;
  InplaceStr name_local;
  
  name_local.begin = name.end;
  ctx_local = (ExpressionTranslateContext *)name.begin;
  local_24 = 0;
  while( true ) {
    uVar1 = InplaceStr::length((InplaceStr *)&ctx_local);
    if (uVar1 <= local_24) break;
    ch_00 = *(char *)((long)(ctx_local->loopBreakIdStack).little + ((ulong)local_24 - 0x58));
    if ((((((ch_00 == ' ') || (ch_00 == '[')) || (ch_00 == ']')) ||
         ((ch_00 == '(' || (ch_00 == ')')))) ||
        ((ch_00 == ',' || ((ch_00 == ':' || (ch_00 == '$')))))) ||
       ((ch_00 == '<' || ((ch_00 == '>' || (ch_00 == '.')))))) {
      OutputContext::Print(ctx->output,"_");
    }
    else {
      OutputContext::Print(ctx->output,ch_00);
    }
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void PrintEscapedName(ExpressionTranslateContext &ctx, InplaceStr name)
{
	for(unsigned i = 0; i < name.length(); i++)
	{
		char ch = name.begin[i];

		if(ch == ' ' || ch == '[' || ch == ']' || ch == '(' || ch == ')' || ch == ',' || ch == ':' || ch == '$' || ch == '<' || ch == '>' || ch == '.')
			ctx.output.Print("_");
		else
			ctx.output.Print(ch);
	}
}